

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrSat.c
# Opt level: O3

int Pdr_ManCheckCube(Pdr_Man_t *p,int k,Pdr_Set_t *pCube,Pdr_Set_t **ppPred,int nConfLimit)

{
  int *piVar1;
  long lVar2;
  Vec_Ptr_t *pVVar3;
  uint Entry;
  Pdr_Set_t **ppPVar4;
  int iVar5;
  int iVar6;
  sat_solver *s;
  Vec_Int_t *pVVar7;
  long lVar8;
  Pdr_Set_t *pPVar9;
  long lVar10;
  timespec *end;
  long lVar11;
  uint *begin;
  abctime aVar12;
  int Lit;
  timespec ts;
  uint local_5c;
  timespec local_58;
  int local_44;
  Pdr_Set_t *local_40;
  Pdr_Set_t **local_38;
  
  p->nCalls = p->nCalls + 1;
  local_38 = ppPred;
  s = Pdr_ManFetchSolver(p,k);
  local_40 = pCube;
  if (pCube == (Pdr_Set_t *)0x0) {
    iVar5 = clock_gettime(3,&local_58);
    if (iVar5 < 0) {
      lVar10 = 1;
    }
    else {
      lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_nsec),8);
      lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_58.tv_sec * -1000000;
    }
    iVar5 = p->iOutCur;
    if (((long)iVar5 < 0) || (pVVar3 = p->pAig->vCos, pVVar3->nSize <= iVar5)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    iVar5 = Pdr_ObjSatVar(p,k,2,(Aig_Obj_t *)pVVar3->pArray[iVar5]);
    local_5c = iVar5 * 2;
    lVar11 = p->timeToStop;
    lVar2 = p->timeToStopOne;
    lVar8 = lVar2;
    if (((lVar11 != 0) && (lVar8 = lVar11, lVar2 != 0)) && (lVar8 = lVar2, lVar11 < lVar2)) {
      lVar8 = lVar11;
    }
    aVar12 = s->nRuntimeLimit;
    s->nRuntimeLimit = lVar8;
    end = &local_58;
    begin = &local_5c;
  }
  else {
    local_44 = nConfLimit;
    if ((k < 0) || (p->vActVars->nSize <= k)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
    }
    piVar1 = p->vActVars->pArray + (uint)k;
    *piVar1 = *piVar1 + 1;
    pVVar7 = Pdr_ManCubeToLits(p,k,pCube,1,0);
    iVar5 = Pdr_ManFreeVar(p,k);
    Entry = iVar5 * 2;
    local_5c = Entry;
    Vec_IntPush(pVVar7,Entry);
    iVar5 = sat_solver_addclause(s,pVVar7->pArray,pVVar7->pArray + pVVar7->nSize);
    if (iVar5 != 1) {
      __assert_fail("RetValue == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrSat.c"
                    ,0x13f,"int Pdr_ManCheckCube(Pdr_Man_t *, int, Pdr_Set_t *, Pdr_Set_t **, int)")
      ;
    }
    sat_solver_compress(s);
    pVVar7 = Pdr_ManCubeToLits(p,k,pCube,0,1);
    Vec_IntPush(pVVar7,Entry | 1);
    iVar5 = clock_gettime(3,&local_58);
    if (iVar5 < 0) {
      lVar10 = 1;
    }
    else {
      lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_nsec),8);
      lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_58.tv_sec * -1000000;
    }
    lVar11 = p->timeToStop;
    lVar2 = p->timeToStopOne;
    lVar8 = lVar2;
    if (((lVar11 != 0) && (lVar8 = lVar11, lVar2 != 0)) && (lVar8 = lVar2, lVar11 < lVar2)) {
      lVar8 = lVar11;
    }
    aVar12 = s->nRuntimeLimit;
    s->nRuntimeLimit = lVar8;
    begin = (uint *)pVVar7->pArray;
    end = (timespec *)(begin + pVVar7->nSize);
    nConfLimit = local_44;
  }
  iVar5 = sat_solver_solve(s,(lit *)begin,(lit *)end,(long)nConfLimit,0,0,0);
  s->nRuntimeLimit = aVar12;
  if (iVar5 == 0) {
    iVar5 = -1;
  }
  else {
    iVar6 = clock_gettime(3,&local_58);
    ppPVar4 = local_38;
    if (iVar6 < 0) {
      lVar11 = -1;
    }
    else {
      lVar11 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
    }
    lVar11 = lVar11 + lVar10;
    p->tSat = p->tSat + lVar11;
    if (iVar5 == -1) {
      p->tSatUnsat = p->tSatUnsat + lVar11;
      p->nCallsU = p->nCallsU + 1;
      iVar5 = 1;
      if (local_38 == (Pdr_Set_t **)0x0) {
        return 1;
      }
      pPVar9 = (Pdr_Set_t *)0x0;
    }
    else {
      p->tSatSat = p->tSatSat + lVar11;
      p->nCallsS = p->nCallsS + 1;
      if (local_38 == (Pdr_Set_t **)0x0) {
        return 0;
      }
      pPVar9 = Pdr_ManTernarySim(p,k,local_40);
      iVar5 = 0;
    }
    *ppPVar4 = pPVar9;
  }
  return iVar5;
}

Assistant:

int Pdr_ManCheckCube( Pdr_Man_t * p, int k, Pdr_Set_t * pCube, Pdr_Set_t ** ppPred, int nConfLimit )
{ 
    int fUseLit = 1;
    int fLitUsed = 0;
    sat_solver * pSat;
    Vec_Int_t * vLits;
    int Lit, RetValue;
    abctime clk, Limit;
    p->nCalls++;
    pSat = Pdr_ManFetchSolver( p, k );
    if ( pCube == NULL ) // solve the property
    {
        clk = Abc_Clock();
        Lit = toLit( Pdr_ObjSatVar(p, k, 2, Aig_ManCo(p->pAig, p->iOutCur)) ); // pos literal (property fails)
        Limit = sat_solver_set_runtime_limit( pSat, Pdr_ManTimeLimit(p) );
        RetValue = sat_solver_solve( pSat, &Lit, &Lit + 1, nConfLimit, 0, 0, 0 );
        sat_solver_set_runtime_limit( pSat, Limit );
        if ( RetValue == l_Undef )
            return -1;
    }
    else // check relative containment in terms of next states
    {
        if ( fUseLit )
        {
            fLitUsed = 1;
            Vec_IntAddToEntry( p->vActVars, k, 1 );
            // add the cube in terms of current state variables
            vLits = Pdr_ManCubeToLits( p, k, pCube, 1, 0 );
            // add activation literal
            Lit = toLit( Pdr_ManFreeVar(p, k) );
            // add activation literal
            Vec_IntPush( vLits, Lit );
            RetValue = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) );
            assert( RetValue == 1 );
            sat_solver_compress( pSat );
            // create assumptions
            vLits = Pdr_ManCubeToLits( p, k, pCube, 0, 1 );
            // add activation literal
            Vec_IntPush( vLits, lit_neg(Lit) );
        }
        else
            vLits = Pdr_ManCubeToLits( p, k, pCube, 0, 1 );

        // solve 
        clk = Abc_Clock();
        Limit = sat_solver_set_runtime_limit( pSat, Pdr_ManTimeLimit(p) );
        RetValue = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), nConfLimit, 0, 0, 0 );
        sat_solver_set_runtime_limit( pSat, Limit );
        if ( RetValue == l_Undef )
            return -1;
/*
        if ( RetValue == l_True )
        {
            int RetValue2 = Pdr_ManCubeJust( p, k, pCube );
            if ( RetValue2 )
                p->nCasesSS++;
            else
                p->nCasesSU++;
        }
        else
        {
            int RetValue2 = Pdr_ManCubeJust( p, k, pCube );
            if ( RetValue2 )
                p->nCasesUS++;
            else
                p->nCasesUU++;
        }
*/
    }
    clk = Abc_Clock() - clk;
    p->tSat += clk;
    assert( RetValue != l_Undef );
    if ( RetValue == l_False )
    {
        p->tSatUnsat += clk;
        p->nCallsU++;
        if ( ppPred )
            *ppPred = NULL;
        RetValue = 1;
    }
    else // if ( RetValue == l_True )
    {
        p->tSatSat += clk;
        p->nCallsS++;
        if ( ppPred )
            *ppPred = Pdr_ManTernarySim( p, k, pCube );
        RetValue = 0;
    }

/* // for some reason, it does not work...
    if ( fLitUsed )
    {
        int RetValue;
        Lit = lit_neg(Lit);
        RetValue = sat_solver_addclause( pSat, &Lit, &Lit + 1 );
        assert( RetValue == 1 );
        sat_solver_compress( pSat );
    }
*/
    return RetValue;
}